

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O2

void __thiscall libtorrent::mmap_disk_io::add_completed_jobs(mmap_disk_io *this,jobqueue_t *jobs)

{
  jobqueue_t local_58;
  jobqueue_t local_38;
  
  local_38.m_first._0_4_ = *(undefined4 *)&jobs->m_first;
  local_38.m_first._4_4_ = *(undefined4 *)((long)&jobs->m_first + 4);
  local_38.m_last._0_4_ = *(undefined4 *)&jobs->m_last;
  local_38.m_last._4_4_ = *(undefined4 *)((long)&jobs->m_last + 4);
  local_38.m_size = jobs->m_size;
  jobs->m_size = 0;
  jobs->m_first = (disk_job *)0x0;
  jobs->m_last = (disk_job *)0x0;
  do {
    local_58.m_size = 0;
    local_58.m_first = (disk_job *)0x0;
    local_58.m_last = (disk_job *)0x0;
    add_completed_jobs_impl(this,&local_38,&local_58);
    local_38.m_first._0_4_ = local_58.m_first._0_4_;
    local_38.m_first._4_4_ = local_58.m_first._4_4_;
    local_38.m_last._0_4_ = local_58.m_last._0_4_;
    local_38.m_last._4_4_ = local_58.m_last._4_4_;
    local_38.m_size = local_58.m_size;
  } while (local_58.m_size != 0);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs(jobqueue_t jobs)
	{
		jobqueue_t completed = std::move(jobs);
		do
		{
			// when a job completes, it's possible for it to cause
			// a fence to be lowered, issuing the jobs queued up
			// behind the fence
			jobqueue_t new_jobs;
			add_completed_jobs_impl(std::move(completed), new_jobs);
			TORRENT_ASSERT(completed.empty());
			completed = std::move(new_jobs);
		} while (!completed.empty());
	}